

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathParseQName(xmlXPathParserContextPtr ctxt,xmlChar **prefix)

{
  xmlChar *local_20;
  xmlChar *ret;
  xmlChar **prefix_local;
  xmlXPathParserContextPtr ctxt_local;
  
  *prefix = (xmlChar *)0x0;
  local_20 = xmlXPathParseNCName(ctxt);
  if ((local_20 != (xmlChar *)0x0) && (*ctxt->cur == ':')) {
    *prefix = local_20;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    local_20 = xmlXPathParseNCName(ctxt);
  }
  return local_20;
}

Assistant:

static xmlChar *
xmlXPathParseQName(xmlXPathParserContextPtr ctxt, xmlChar **prefix) {
    xmlChar *ret = NULL;

    *prefix = NULL;
    ret = xmlXPathParseNCName(ctxt);
    if (ret && CUR == ':') {
        *prefix = ret;
	NEXT;
	ret = xmlXPathParseNCName(ctxt);
    }
    return(ret);
}